

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O3

void __thiscall
chaiscript::ChaiScript_Basic::ChaiScript_Basic
          (ChaiScript_Basic *this,ModulePtr *t_lib,
          unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
          *parser,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *t_module_paths,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *t_use_paths,vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *t_opts)

{
  _Rb_tree_header *p_Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator __position;
  long lVar3;
  int iVar4;
  char *__buf;
  ssize_t sVar5;
  size_type sVar6;
  value_type *__val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string dllpath;
  Dl_info rInfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  Dispatch_Engine *local_a8;
  vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  char *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  size_type sVar7;
  
  this->_vptr_ChaiScript_Basic = (_func_int **)&PTR__ChaiScript_Basic_003d1fe8;
  *(undefined8 *)((long)&(this->m_use_mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_use_mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x30) = 0;
  (this->m_use_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->m_use_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_use_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_use_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  p_Var1 = &(this->m_used_files)._M_t._M_impl.super__Rb_tree_header;
  (this->m_used_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_used_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_used_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_used_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_used_files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__ = &this->m_module_paths;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_module_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_module_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_module_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_module_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t_module_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_module_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = t_opts;
  ensure_minimum_path_vec(__return_storage_ptr__,this,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  local_d0 = &this->m_use_paths;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_use_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_use_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_use_paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_use_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_use_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (t_use_paths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ensure_minimum_path_vec(local_d0,this,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  (this->m_parser)._M_t.
  super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl =
       (parser->_M_t).
       super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
       ._M_t.
       super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
       .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl;
  (parser->_M_t).
  super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl =
       (ChaiScript_Parser_Base *)0x0;
  local_a8 = &this->m_engine;
  detail::Dispatch_Engine::Dispatch_Engine
            (local_a8,(this->m_parser)._M_t.
                      super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
                      .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>.
                      _M_head_impl);
  p_Var1 = &(this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header;
  (this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_namespace_generators)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (char *)0x0;
  uStack_50 = 0;
  iVar4 = dladdr(use,&local_58);
  if (local_58 != (char *)0x0 && iVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,local_58,(allocator<char> *)&local_f0);
    sVar7 = local_c8._M_string_length;
    if (local_c8._M_string_length != 0) {
      do {
        sVar6 = sVar7 - 1;
        if (sVar7 == 0) goto LAB_002a594d;
        lVar3 = sVar7 - 1;
        sVar7 = sVar6;
      } while (local_c8._M_dataplus._M_p[lVar3] != '/');
      local_c8._M_dataplus._M_p[sVar6] = '\0';
      local_c8._M_string_length = sVar6;
    }
LAB_002a594d:
    __buf = (char *)operator_new(0x800);
    memset(__buf,0,0x800);
    sVar5 = readlink(local_c8._M_dataplus._M_p,__buf,0x800);
    paVar2 = &local_f0.field_2;
    if (sVar5 - 1U < 0x7ff) {
      local_f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,__buf,__buf + sVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_c8,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_f0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_f0,"/");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(__return_storage_ptr__,__position,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    operator_delete(__buf,0x800);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  build_eval_system(this,t_lib,local_a0);
  return;
}

Assistant:

ChaiScript_Basic(const ModulePtr &t_lib,
                     std::unique_ptr<parser::ChaiScript_Parser_Base> &&parser,
                     std::vector<std::string> t_module_paths = {},
                     std::vector<std::string> t_use_paths = {},
                     const std::vector<chaiscript::Options> &t_opts = chaiscript::default_options())
        : m_module_paths(ensure_minimum_path_vec(std::move(t_module_paths)))
        , m_use_paths(ensure_minimum_path_vec(std::move(t_use_paths)))
        , m_parser(std::move(parser))
        , m_engine(*m_parser) {
#if !defined(CHAISCRIPT_NO_DYNLOAD) && defined(_POSIX_VERSION) && !defined(__CYGWIN__)
      // If on Unix, add the path of the current executable to the module search path
      // as windows would do

      union cast_union {
        Boxed_Value (ChaiScript_Basic::*in_ptr)(const std::string &);
        void *out_ptr;
      };

      Dl_info rInfo;
      memset(&rInfo, 0, sizeof(rInfo));
      cast_union u;
      u.in_ptr = &ChaiScript_Basic::use;
      if ((dladdr(static_cast<void *>(u.out_ptr), &rInfo) != 0) && (rInfo.dli_fname != nullptr)) {
        std::string dllpath(rInfo.dli_fname);
        const size_t lastslash = dllpath.rfind('/');
        if (lastslash != std::string::npos) {
          dllpath.erase(lastslash);
        }

        // Let's see if this is a link that we should expand
        std::vector<char> buf(2048);
        const auto pathlen = readlink(dllpath.c_str(), &buf.front(), buf.size());
        if (pathlen > 0 && static_cast<size_t>(pathlen) < buf.size()) {
          dllpath = std::string(&buf.front(), static_cast<size_t>(pathlen));
        }

        m_module_paths.insert(m_module_paths.begin(), dllpath + "/");
      }
#endif
      build_eval_system(t_lib, t_opts);
    }